

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::MaybeAppend(State *state,char *str)

{
  long lVar1;
  bool in_AL;
  bool extraout_AL;
  bool extraout_AL_00;
  long lVar2;
  
  if (-1 < *(int *)&(state->parse_state).field_0xc) {
    return in_AL;
  }
  if (*str != '\0') {
    lVar2 = 0;
    do {
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (str[lVar1] != '\0');
    MaybeAppendWithLength(state,str,(int)lVar2);
    return extraout_AL;
  }
  MaybeAppendWithLength(state,str,0);
  return extraout_AL_00;
}

Assistant:

static bool MaybeAppend(State *state, const char *const str) {
  if (state->parse_state.append) {
    int length = StrLen(str);
    MaybeAppendWithLength(state, str, length);
  }
  return true;
}